

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrUtils-CPConv_IConv.c
# Opt level: O1

UINT8 CPConv_StrConvert(CPCONV *cpc,size_t *outSize,char **outStr,size_t inSize,char *inStr)

{
  int iVar1;
  UINT8 UVar2;
  char *pcVar3;
  size_t sVar4;
  int *piVar5;
  size_t sVar6;
  long lVar7;
  size_t __size;
  char *outPtr;
  size_t remBytesIn;
  size_t remBytesOut;
  char *inPtr;
  char *local_58;
  size_t local_50;
  size_t *local_48;
  size_t local_40;
  char *local_38;
  
  iconv(cpc->hIConv,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
  if (inSize == 0) {
    inSize = strlen(inStr);
  }
  if (inSize == 0) {
    UVar2 = '\x02';
    sVar6 = 0;
  }
  else {
    local_50 = inSize;
    local_38 = inStr;
    if (*outStr == (char *)0x0) {
      __size = inSize * 3 >> 1;
      pcVar3 = (char *)malloc(__size);
      *outStr = pcVar3;
    }
    else {
      __size = *outSize;
    }
    local_58 = *outStr;
    local_40 = __size;
    sVar4 = iconv(cpc->hIConv,&local_38,&local_50,&local_58,&local_40);
    if (sVar4 == 0xffffffffffffffff) {
      local_48 = outSize;
      piVar5 = __errno_location();
      do {
        outSize = local_48;
        iVar1 = *piVar5;
        if ((iVar1 == 0x54) || (iVar1 == 0x16)) {
          UVar2 = 0x80;
          if ((iVar1 == 0x16) && (local_50 < 2)) {
            iconv(cpc->hIConv,(char **)0x0,(size_t *)0x0,&local_58,&local_40);
            UVar2 = '\x01';
          }
          goto LAB_0016f54f;
        }
        lVar7 = (long)local_58 - (long)*outStr;
        __size = __size + local_50 * 2;
        local_58 = (char *)realloc(*outStr,__size);
        *outStr = local_58;
        local_58 = local_58 + lVar7;
        local_40 = __size - lVar7;
        sVar4 = iconv(cpc->hIConv,&local_38,&local_50,&local_58,&local_40);
      } while (sVar4 == 0xffffffffffffffff);
      UVar2 = '\0';
      outSize = local_48;
    }
    else {
      UVar2 = '\0';
    }
LAB_0016f54f:
    sVar6 = (long)local_58 - (long)*outStr;
  }
  *outSize = sVar6;
  return UVar2;
}

Assistant:

UINT8 CPConv_StrConvert(CPCONV* cpc, size_t* outSize, char** outStr, size_t inSize, const char* inStr)
{
	size_t outBufSize;
	size_t remBytesIn;
	size_t remBytesOut;
	char* inPtr;
	char* outPtr;
	size_t wrtBytes;
	char resVal;
	
	iconv(cpc->hIConv, NULL, NULL, NULL, NULL);	// reset conversion state
	
	remBytesIn = inSize ? inSize : strlen(inStr);
	inPtr = (char*)&inStr[0];	// const-cast due to a bug in the API
	if (remBytesIn == 0)
	{
		*outSize = 0;
		return 0x02;	// nothing to convert
	}
	
	if (*outStr == NULL)
	{
		outBufSize = remBytesIn * 3 / 2;
		*outStr = (char*)malloc(outBufSize);
	}
	else
	{
		outBufSize = *outSize;
	}
	remBytesOut = outBufSize;
	outPtr = *outStr;
	
	resVal = 0x00;
	wrtBytes = iconv(cpc->hIConv, &inPtr, &remBytesIn, &outPtr, &remBytesOut);
	while(wrtBytes == (size_t)-1)
	{
		if (errno == EILSEQ || errno == EINVAL)
		{
			// invalid encoding
			resVal = 0x80;
			if (errno == EINVAL && remBytesIn <= 1)
			{
				// assume that the string got truncated
				iconv(cpc->hIConv, NULL, NULL, &outPtr, &remBytesOut);
				resVal = 0x01;
			}
			break;
		}
		// errno == E2BIG
		wrtBytes = outPtr - *outStr;
		outBufSize += remBytesIn * 2;
		*outStr = (char*)realloc(*outStr, outBufSize);
		outPtr = *outStr + wrtBytes;
		remBytesOut = outBufSize - wrtBytes;
		
		wrtBytes = iconv(cpc->hIConv, &inPtr, &remBytesIn, &outPtr, &remBytesOut);
	}
	
	*outSize = outPtr - *outStr;
	return resVal;
}